

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::moveAppend
          (QGenericArrayOps<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *this,
          X509CertificateExtension *b,X509CertificateExtension *e)

{
  qsizetype *pqVar1;
  undefined8 *puVar2;
  X509CertificateExtension *pXVar3;
  long lVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  PrivateShared *pPVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  
  if ((b != e) && (b < e)) {
    pXVar3 = (this->
             super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).
             ptr;
    do {
      lVar4 = (this->
              super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).
              size;
      pDVar5 = (b->oid).d.d;
      (b->oid).d.d = (Data *)0x0;
      pXVar3[lVar4].oid.d.d = pDVar5;
      pcVar6 = (b->oid).d.ptr;
      (b->oid).d.ptr = (char16_t *)0x0;
      pXVar3[lVar4].oid.d.ptr = pcVar6;
      qVar7 = (b->oid).d.size;
      (b->oid).d.size = 0;
      pXVar3[lVar4].oid.d.size = qVar7;
      pDVar5 = (b->name).d.d;
      (b->name).d.d = (Data *)0x0;
      pXVar3[lVar4].name.d.d = pDVar5;
      pcVar6 = (b->name).d.ptr;
      (b->name).d.ptr = (char16_t *)0x0;
      pXVar3[lVar4].name.d.ptr = pcVar6;
      qVar7 = (b->name).d.size;
      (b->name).d.size = 0;
      pXVar3[lVar4].name.d.size = qVar7;
      pPVar8 = (b->value).d.data.shared;
      uVar9 = *(undefined8 *)((long)&(b->value).d.data + 8);
      uVar10 = *(undefined8 *)&(b->value).d.field_0x18;
      puVar2 = (undefined8 *)((long)&pXVar3[lVar4].value.d.data + 0x10);
      *puVar2 = *(undefined8 *)((long)&(b->value).d.data + 0x10);
      puVar2[1] = uVar10;
      pXVar3[lVar4].value.d.data.shared = pPVar8;
      *(undefined8 *)((long)&pXVar3[lVar4].value.d.data + 8) = uVar9;
      (b->value).d.data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(b->value).d.data + 8) = 0;
      *(undefined8 *)((long)&(b->value).d.data + 0x10) = 0;
      *(undefined8 *)&(b->value).d.field_0x18 = 2;
      bVar11 = b->supported;
      pXVar3[lVar4].critical = b->critical;
      pXVar3[lVar4].supported = bVar11;
      b = b + 1;
      pqVar1 = &(this->
                super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>)
                .size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }